

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O3

void __thiscall raspicam::_private::Private_Impl_Still::commitFlips(Private_Impl_Still *this)

{
  char *__s;
  MMAL_STATUS_T MVar1;
  size_t sVar2;
  MMAL_PARAMETER_MIRROR_T mirror;
  MMAL_PARAMETER_HEADER_T local_18;
  undefined4 local_10;
  
  local_18.id = 0x1000f;
  local_18.size = 0xc;
  local_10 = 0;
  if (this->horizontalFlip == true) {
    if (this->verticalFlip == false) {
      local_10 = 2;
    }
    else {
      local_10 = 3;
    }
  }
  else if (this->verticalFlip != false) {
    local_10 = 1;
  }
  MVar1 = mmal_port_parameter_set(*this->camera->output,&local_18);
  if (((MVar1 == MMAL_SUCCESS) &&
      (MVar1 = mmal_port_parameter_set(this->camera->output[1],&local_18), MVar1 == MMAL_SUCCESS))
     && (MVar1 = mmal_port_parameter_set(this->camera->output[2],&local_18), MVar1 == MMAL_SUCCESS))
  {
    return;
  }
  __s = this->API_NAME;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,": Failed to set horizontal/vertical flip parameter.\n",0x34);
  return;
}

Assistant:

void Private_Impl_Still::commitFlips() {
            MMAL_PARAMETER_MIRROR_T mirror = {{MMAL_PARAMETER_MIRROR, sizeof ( MMAL_PARAMETER_MIRROR_T ) }, MMAL_PARAM_MIRROR_NONE};
            if ( horizontalFlip && verticalFlip )
                mirror.value = MMAL_PARAM_MIRROR_BOTH;
            else if ( horizontalFlip )
                mirror.value = MMAL_PARAM_MIRROR_HORIZONTAL;
            else if ( verticalFlip )
                mirror.value = MMAL_PARAM_MIRROR_VERTICAL;
            if ( mmal_port_parameter_set ( camera->output[0], &mirror.hdr ) != MMAL_SUCCESS ||
                    mmal_port_parameter_set ( camera->output[1], &mirror.hdr ) != MMAL_SUCCESS ||
                    mmal_port_parameter_set ( camera->output[2], &mirror.hdr ) )
                cout << API_NAME << ": Failed to set horizontal/vertical flip parameter.\n";
        }